

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::InputScalarN(char *label,ImGuiDataType data_type,void *v,int components,void *step,
                        void *step_fast,char *format,ImGuiInputTextFlags flags)

{
  ImGuiWindow *pIVar1;
  size_t sVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  char *text_end;
  int int_id;
  bool bVar5;
  float w_full;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  int_id = 0;
  bVar5 = false;
  if (pIVar1->SkipItems == false) {
    BeginGroup();
    PushID(label);
    w_full = GetNextItemWidth();
    PushMultiItemsWidths(components,w_full);
    sVar2 = GDataTypeInfo[data_type].Size;
    if (components < 1) {
      components = 0;
    }
    bVar5 = false;
    for (; components != int_id; int_id = int_id + 1) {
      PushID(int_id);
      bVar4 = InputScalar("",data_type,v,step,step_fast,format,flags);
      bVar5 = (bool)(bVar5 | bVar4);
      SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
      PopID();
      PopItemWidth();
      v = (void *)((long)v + sVar2);
    }
    PopID();
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextEx(label,text_end,0);
    EndGroup();
  }
  return bVar5;
}

Assistant:

bool ImGui::InputScalarN(const char* label, ImGuiDataType data_type, void* v, int components, const void* step, const void* step_fast, const char* format, ImGuiInputTextFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components, GetNextItemWidth());
    size_t type_size = GDataTypeInfo[data_type].Size;
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        value_changed |= InputScalar("", data_type, v, step, step_fast, format, flags);
        SameLine(0, g.Style.ItemInnerSpacing.x);
        PopID();
        PopItemWidth();
        v = (void*)((char*)v + type_size);
    }
    PopID();

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    return value_changed;
}